

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

int SHA1_Update(SHA_CTX *c,void *data,size_t len)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  
  uVar1 = c->Nl;
  uVar3 = (int)len * 8;
  c->Nl = uVar3 + uVar1;
  c->Nh = c->Nh + (int)(len >> 0x1d) + (uint)CARRY4(uVar3,uVar1);
  uVar4 = (ulong)(uVar1 >> 3 & 0x3f);
  if (uVar4 + len < 0x40) {
    __n = 0;
  }
  else {
    __n = 0x40 - uVar4;
    memcpy((void *)((long)c->data + uVar4),data,__n);
    SHA1_Transform(c,(uchar *)c->data);
    uVar4 = 0;
    for (; __n + 0x3f < len; __n = __n + 0x40) {
      SHA1_Transform(c,(uchar *)((long)data + __n));
    }
  }
  pvVar2 = memcpy((void *)((long)c->data + uVar4),(void *)((long)data + __n),len - __n);
  return (int)pvVar2;
}

Assistant:

void SHA1_Update(SHA1_CTX *context, const uint8_t *data, const size_t len) {
  size_t i, j;

  j = context->count[0];
  if ((context->count[0] += len << 3) < j)
    context->count[1]++;
  context->count[1] += (len >> 29);
  j = (j >> 3) & 63;
  if ((j + len) > 63) {
    memcpy(&context->buffer[j], data, (i = 64 - j));
    SHA1_Transform(context->state, context->buffer);
    for (; i + 63 < len; i += 64) {
      SHA1_Transform(context->state, &data[i]);
    }
    j = 0;
  } else
    i = 0;
  memcpy(&context->buffer[j], &data[i], len - i);
}